

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Function * __thiscall
despot::Parser::CreateRewardFunction
          (Function *__return_storage_ptr__,Parser *this,TiXmlElement *e_Func)

{
  NamedVar *child_00;
  bool bVar1;
  TiXmlNode *base;
  mapped_type *ppVVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  TiXmlElement *pTVar6;
  size_type sVar7;
  size_type t;
  char *__nptr;
  reference pvVar8;
  double dVar9;
  allocator<char> local_379;
  string local_378;
  undefined1 local_355;
  int local_354;
  undefined1 local_350 [3];
  bool success;
  int i_1;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  string local_288;
  undefined1 local_268 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  undefined1 local_248 [4];
  int num_entries;
  string table;
  vector<double,_std::allocator<double>_> values;
  value_type local_208;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  TiXmlElement *e_Entry;
  TiXmlElement *e_Parameter;
  undefined1 local_159;
  value_type local_158;
  undefined1 local_150 [8];
  string str;
  int i;
  string local_108;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  NamedVar *child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  undefined1 local_40 [8];
  string name;
  TiXmlElement *e_Func_local;
  Parser *this_local;
  Function *func;
  
  name.field_2._8_8_ = e_Func;
  GetFirstChildText_abi_cxx11_((string *)local_40,this,e_Func,"Var");
  std::__cxx11::string::string((string *)&local_60,(string *)local_40);
  bVar1 = Variable::IsVariableName(&local_60,&this->reward_vars_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 "In <RewardFunction>: Variable ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                 " has not been declared as a RewardVar vname within <Variable> tag.");
  base = util::tinyxml::TiXmlNode::FirstChild((TiXmlNode *)name.field_2._8_8_,"Var");
  Ensure(this,bVar1,&local_90,&base->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&child);
  std::__cxx11::string::~string((string *)&local_60);
  ppVVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,(key_type *)local_40);
  child_00 = (NamedVar *)*ppVVar2;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  GetFirstChildText_abi_cxx11_(&local_108,this,(TiXmlElement *)name.field_2._8_8_,"Parent");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i," ",(allocator<char> *)(str.field_2._M_local_buf + 0xf));
  Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,&local_108,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_108);
  for (str.field_2._8_4_ = 0; uVar3 = (ulong)(int)str.field_2._8_4_,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e8), uVar3 < sVar4; str.field_2._8_4_ = str.field_2._8_4_ + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e8,(long)(int)str.field_2._8_4_);
    std::__cxx11::string::string((string *)local_150,(string *)pvVar5);
    ppVVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,(key_type *)local_150);
    local_158 = (value_type)*ppVVar2;
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::push_back
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
               &parent_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
    std::__cxx11::string::~string((string *)local_150);
  }
  local_159 = 0;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Function::Function(__return_storage_ptr__,child_00,
                     (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter
                    );
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&e_Parameter);
  pTVar6 = GetParameterElement(this,(TiXmlElement *)name.field_2._8_8_);
  instance.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)util::tinyxml::TiXmlNode::FirstChildElement(&pTVar6->super_TiXmlNode,"Entry");
  while (instance.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    GetFirstChildText_abi_cxx11_
              (&local_1c0,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0," ",&local_1e1);
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a0,&local_1c0,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"rew",
               (allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    GetFirstChildText_abi_cxx11_
              ((string *)local_248,this,
               (TiXmlElement *)
               instance.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ValueTable");
    value_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         ComputeNumOfEntries(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1a0,
                             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                             &parent_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,child_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288," ",&local_289);
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_268,(string *)local_248,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    sVar4 = (size_type)
            value_tokens.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_268);
    to_string<int>(&local_330,
                   value_tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::operator+(&local_310,"In <RewardFunction>: ",&local_330);
    std::operator+(&local_2f0,&local_310," entries expected but ");
    t = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_268);
    to_string<unsigned_long>((string *)local_350,t);
    std::operator+(&local_2d0,&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
    std::operator+(&local_2b0,&local_2d0," found.");
    pTVar6 = GetFirstChildElement
                       (this,(TiXmlElement *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"ValueTable");
    Ensure(this,sVar4 == sVar7,&local_2b0,(TiXmlBase *)pTVar6);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_268);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),sVar4);
    for (local_354 = 0; uVar3 = (ulong)local_354,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_268), uVar3 < sVar4; local_354 = local_354 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_268,(long)local_354);
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar9 = atof(__nptr);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8),
                          (long)local_354);
      *pvVar8 = dVar9;
    }
    bVar1 = Function::SetValue(__return_storage_ptr__,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1a0,
                               (vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8)
                              );
    local_355 = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"In <RewardFunction>: Value assignment failed.",&local_379);
    pTVar6 = GetFirstChildElement
                       (this,(TiXmlElement *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"Instance");
    Ensure(this,bVar1,&local_378,(TiXmlBase *)pTVar6);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    instance.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                            ((TiXmlNode *)
                             instance.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_268);
    std::__cxx11::string::~string((string *)local_248);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)((long)&table.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
  }
  local_159 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
             &parent_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Function Parser::CreateRewardFunction(TiXmlElement* e_Func) {
	// <Var>
	string name = GetFirstChildText(e_Func, "Var");

	Ensure(Variable::IsVariableName(name, reward_vars_),
		"In <RewardFunction>: Variable " + name
			+ " has not been declared as a RewardVar vname within <Variable> tag.",
		e_Func->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(GetFirstChildText(e_Func, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string str = parent_names[i];
		parents.push_back(static_cast<StateVar*>(variables_[str]));
	}

	Function func(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_Func);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));
		instance.push_back(REWARD_VAR_VALUE);

		// <ValueTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ValueTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		vector<string> value_tokens = Tokenize(table);

		Ensure(num_entries == value_tokens.size(),
			"In <RewardFunction>: " + to_string(num_entries)
				+ " entries expected but " + to_string(value_tokens.size())
				+ " found.", GetFirstChildElement(e_Entry, "ValueTable"));

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		bool success = func.SetValue(instance, values);

		Ensure(success, "In <RewardFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}